

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_rowcol_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  short sVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  short sVar9;
  short sVar10;
  bool bVar11;
  short sVar12;
  bool bVar13;
  short sVar14;
  bool bVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [16];
  unkbyte10 Var19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ushort uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  parasail_result_t *ppVar29;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  int16_t *piVar34;
  ulong uVar35;
  char *pcVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  int iVar43;
  ulong uVar44;
  char *__format;
  uint uVar45;
  uint uVar47;
  ulong uVar48;
  uint uVar49;
  uint uVar50;
  int16_t iVar51;
  uint uVar52;
  undefined8 unaff_R12;
  ulong uVar53;
  long lVar54;
  uint uVar55;
  short sVar56;
  undefined4 uVar57;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined4 uVar58;
  undefined1 auVar61 [16];
  short sVar63;
  short sVar69;
  undefined1 auVar62 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  ushort uVar76;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  undefined1 auVar77 [16];
  ushort uVar86;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  ulong local_238;
  ulong local_200;
  int16_t *local_1f8;
  undefined1 local_1a8 [16];
  short local_198;
  short sStack_196;
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  int iVar46;
  short sVar91;
  short sVar94;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar36 = "_s2";
LAB_006accfc:
    fprintf(_stderr,__format,"parasail_sg_flags_rowcol_diag_sse41_128_16",pcVar36);
    return (parasail_result_t *)0x0;
  }
  uVar53 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar36 = "s2Len";
    goto LAB_006accfc;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar36 = "open";
    goto LAB_006accfc;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar36 = "gap";
    goto LAB_006accfc;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar36 = "matrix";
    goto LAB_006accfc;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar36 = "_s1";
      goto LAB_006accfc;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar36 = "_s1Len";
      goto LAB_006accfc;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  uVar40 = s2Len + 7;
  iVar43 = -open;
  iVar1 = matrix->min;
  iVar46 = -iVar1;
  if (iVar1 != iVar43 && SBORROW4(iVar1,iVar43) == iVar1 + open < 0) {
    iVar46 = open;
  }
  uVar45 = iVar46 - 0x7fff;
  iVar1 = matrix->max;
  auVar59 = pshuflw(ZEXT416(uVar45),ZEXT416(uVar45),0);
  uVar57 = auVar59._0_4_;
  local_198 = auVar59._0_2_;
  sStack_196 = auVar59._2_2_;
  local_d8 = 0;
  local_188 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    auVar59 = pshuflw(ZEXT416((uint)(gap * 8)),ZEXT416((uint)(gap * 8)),0);
    local_d8 = auVar59._0_4_;
  }
  local_138._0_8_ = CONCAT26(sStack_196,CONCAT24(local_198,uVar57));
  local_138._8_8_ = CONCAT26(sStack_196,CONCAT24(local_198,uVar57));
  local_148._8_8_ = local_138._8_8_;
  local_148._0_8_ = local_138._0_8_;
  local_c8._8_8_ = local_138._8_8_;
  local_c8._0_8_ = local_138._0_8_;
  local_158._8_8_ = local_138._8_8_;
  local_158._0_8_ = local_138._0_8_;
  uVar25 = (ushort)iVar43;
  sVar17 = (short)gap;
  if (s1_beg == 0) {
    local_188._8_8_ =
         (ulong)(uint)(gap * 0xfffd - open) & 0xffff | (ulong)(ushort)(uVar25 + sVar17 * -2) << 0x10
         | (ulong)(ushort)(uVar25 - sVar17) << 0x20 | (ulong)uVar25 << 0x30;
    local_188._0_8_ =
         (ulong)(uint)(gap * 0xfff9 - open) & 0xffffffff0000ffff |
         (ulong)(ushort)(sVar17 * -6 - (short)open) << 0x10 |
         (ulong)(ushort)(sVar17 * -5 - (short)open) << 0x20 |
         (ulong)(ushort)(uVar25 + sVar17 * -4) << 0x30;
  }
  uStack_d4 = local_d8;
  uStack_d0 = local_d8;
  uStack_cc = local_d8;
  ppVar29 = parasail_result_new_rowcol1(_s1Len,s2Len);
  if (ppVar29 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar29->flag =
       (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
       (uint)(s2_end != 0) << 0xf | ppVar29->flag | 0x8241002;
  uVar37 = (ulong)(s2Len + 0xe);
  ptr = parasail_memalign_int16_t(0x10,uVar37);
  ptr_00 = parasail_memalign_int16_t(0x10,uVar37);
  ptr_01 = parasail_memalign_int16_t(0x10,uVar37);
  if (ptr_01 == (int16_t *)0x0 || (ptr_00 == (int16_t *)0x0 || ptr == (int16_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  lVar54 = (long)_s1Len;
  if (matrix->type == 0) {
    local_1f8 = parasail_memalign_int16_t(0x10,(long)(int)(_s1Len + 7));
    uVar37 = 0;
    if (local_1f8 == (int16_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    uVar35 = 0;
    if (0 < _s1Len) {
      uVar35 = (ulong)(uint)_s1Len;
    }
    for (; lVar33 = lVar54, uVar35 != uVar37; uVar37 = uVar37 + 1) {
      local_1f8[uVar37] = (int16_t)matrix->mapper[(byte)_s1[uVar37]];
    }
    for (; lVar33 < (int)(_s1Len + 7); lVar33 = lVar33 + 1) {
      local_1f8[lVar33] = 0;
    }
  }
  else {
    local_1f8 = (int16_t *)0x0;
  }
  auVar59 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R12 >> 0x10),0x7ffe - (short)iVar1));
  auVar60 = pshuflw(ZEXT416((uint)_s1Len),ZEXT416((uint)_s1Len),0);
  auVar70 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
  auVar73 = pshuflw(auVar59,auVar59,0);
  auVar77 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
  auVar59 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
  uVar58 = auVar60._0_4_;
  local_58._4_4_ = uVar58;
  local_58._0_4_ = uVar58;
  local_58._8_4_ = uVar58;
  local_58._12_4_ = uVar58;
  auVar87._8_4_ = 0xffffffff;
  auVar87._0_8_ = 0xffffffffffffffff;
  auVar87._12_4_ = 0xffffffff;
  local_78._0_4_ = auVar70._0_4_;
  local_78._4_4_ = local_78._0_4_;
  local_78._8_4_ = local_78._0_4_;
  local_78._12_4_ = local_78._0_4_;
  local_e8 = auVar73._0_2_;
  sStack_e6 = auVar73._2_2_;
  local_88 = auVar77._0_4_;
  uStack_84 = local_88;
  uStack_80 = local_88;
  uStack_7c = local_88;
  local_98 = auVar59._0_4_;
  uStack_94 = local_98;
  uStack_90 = local_98;
  uStack_8c = local_98;
  auVar24 = local_58;
  local_a8 = paddsw(local_58,auVar87);
  auVar59 = local_a8;
  auVar23 = local_78;
  local_68 = paddsw(auVar87,local_78);
  auVar87 = local_68;
  piVar2 = matrix->mapper;
  for (uVar37 = 0; uVar53 != uVar37; uVar37 = uVar37 + 1) {
    ptr[uVar37 + 7] = (int16_t)piVar2[(byte)_s2[uVar37]];
  }
  for (lVar33 = 0; lVar33 != 7; lVar33 = lVar33 + 1) {
    ptr[lVar33] = 0;
  }
  piVar34 = ptr + uVar53 + 7;
  for (uVar37 = uVar53; (int)uVar37 < (int)uVar40; uVar37 = (ulong)((int)uVar37 + 1)) {
    *piVar34 = 0;
    piVar34 = piVar34 + 1;
  }
  uVar37 = 0;
  iVar51 = (int16_t)uVar45;
  iVar1 = iVar43;
  if (s2_beg == 0) {
    for (; uVar53 != uVar37; uVar37 = uVar37 + 1) {
      ptr_00[uVar37 + 7] = (int16_t)iVar1;
      ptr_01[uVar37 + 7] = iVar51;
      iVar1 = iVar1 - gap;
    }
  }
  else {
    for (; uVar53 != uVar37; uVar37 = uVar37 + 1) {
      ptr_00[uVar37 + 7] = 0;
      ptr_01[uVar37 + 7] = iVar51;
    }
  }
  for (lVar33 = 0; uVar37 = uVar53, lVar33 != 7; lVar33 = lVar33 + 1) {
    ptr_00[lVar33] = iVar51;
    ptr_01[lVar33] = iVar51;
  }
  for (; (int)uVar37 < (int)uVar40; uVar37 = uVar37 + 1) {
    ptr_00[uVar37 + 7] = iVar51;
    ptr_01[uVar37 + 7] = iVar51;
  }
  ptr_00[6] = 0;
  uVar55 = _s1Len - 1;
  uVar37 = (ulong)uVar55;
  Var19 = CONCAT28(local_198,CONCAT26(sStack_196,CONCAT24(local_198,uVar57)));
  auVar18._10_2_ = sStack_196;
  auVar18._0_10_ = Var19;
  auVar18._12_2_ = local_198;
  auVar18._14_2_ = sStack_196;
  local_b8 = auVar18 >> 0x10;
  auVar22 = local_b8;
  uVar31 = s2Len - 1;
  if ((int)uVar40 < 1) {
    uVar40 = 0;
  }
  local_f0 = uVar53 + 6;
  local_f8 = uVar53 + 5;
  local_100 = uVar53 + 4;
  local_108 = uVar53 + 3;
  local_110 = uVar53 + 2;
  local_118 = uVar53 + 1;
  local_1a8 = pmovsxbw(auVar77,0x1020304050607);
  local_178 = CONCAT26(sStack_e6,CONCAT24(local_e8,auVar73._0_4_));
  uStack_170 = CONCAT26(sStack_e6,CONCAT24(local_e8,auVar73._0_4_));
  uVar35 = 0;
  auVar73 = auVar18;
  local_158 = auVar18;
  local_48 = auVar18;
  local_c8 = auVar18;
  auVar77 = auVar18;
  local_168 = auVar18;
  while ((long)uVar35 < lVar54) {
    uVar32 = (uint)uVar35;
    if (matrix->type == 0) {
      uVar26 = (uint)local_1f8[uVar35 + 1];
      uVar27 = (uint)local_1f8[uVar35 + 2];
      uVar41 = (uint)local_1f8[uVar35 + 3];
      uVar28 = (uint)local_1f8[uVar35 + 4];
      uVar52 = (uint)local_1f8[uVar35 + 5];
      uVar47 = (uint)local_1f8[uVar35 + 6];
      uVar50 = (int)local_1f8[uVar35];
      uVar49 = (int)local_1f8[uVar35 + 7];
    }
    else {
      uVar26 = uVar55;
      if ((long)(uVar35 | 1) < lVar54) {
        uVar26 = uVar32 | 1;
      }
      uVar27 = uVar32 | 2;
      if (lVar54 <= (long)(uVar35 | 2)) {
        uVar27 = uVar55;
      }
      uVar41 = uVar32 | 3;
      if (lVar54 <= (long)(uVar35 | 3)) {
        uVar41 = uVar55;
      }
      uVar28 = uVar32 | 4;
      if (lVar54 <= (long)(uVar35 | 4)) {
        uVar28 = uVar55;
      }
      uVar52 = uVar32 | 5;
      if (lVar54 <= (long)(uVar35 | 5)) {
        uVar52 = uVar55;
      }
      uVar47 = uVar32 | 6;
      if (lVar54 <= (long)(uVar35 | 6)) {
        uVar47 = uVar55;
      }
      uVar50 = uVar32;
      uVar49 = uVar32 | 7;
      if (lVar54 <= (long)(uVar35 | 7)) {
        uVar49 = uVar55;
      }
    }
    local_200 = uVar35 | 2;
    local_238 = uVar35 | 1;
    uVar48 = uVar35 | 7;
    uVar44 = uVar35 | 5;
    uVar39 = uVar35 | 3;
    uVar38 = uVar35 | 4;
    uVar30 = uVar35 | 6;
    piVar2 = matrix->matrix;
    iVar1 = matrix->size;
    local_b8._0_8_ = (undefined8)((unkuint10)Var19 >> 0x10);
    local_b8._8_8_ = auVar18._8_8_ >> 0x10;
    auVar74._8_8_ = local_b8._8_8_ | (ulong)(ushort)ptr_00[6] << 0x30;
    auVar74._0_8_ = local_b8._0_8_;
    uVar32 = iVar43 - uVar32 * gap;
    if (s1_beg != 0) {
      uVar32 = 0;
    }
    auVar89._8_8_ = local_b8._8_8_ | (ulong)uVar32 << 0x30;
    auVar89._0_8_ = local_b8._0_8_;
    local_120 = uVar35 + 8;
    ptr_00[6] = uVar25 - (short)(uVar35 + 8) * sVar17;
    auVar88._0_2_ = -(ushort)(local_a8._0_2_ == local_1a8._0_2_);
    auVar88._2_2_ = -(ushort)(local_a8._2_2_ == local_1a8._2_2_);
    auVar88._4_2_ = -(ushort)(local_a8._4_2_ == local_1a8._4_2_);
    auVar88._6_2_ = -(ushort)(local_a8._6_2_ == local_1a8._6_2_);
    auVar88._8_2_ = -(ushort)(local_a8._8_2_ == local_1a8._8_2_);
    auVar88._10_2_ = -(ushort)(local_a8._10_2_ == local_1a8._10_2_);
    auVar88._12_2_ = -(ushort)(local_a8._12_2_ == local_1a8._12_2_);
    auVar88._14_2_ = -(ushort)(local_a8._14_2_ == local_1a8._14_2_);
    uVar42 = 0;
    auVar92._4_2_ = local_198;
    auVar92._0_4_ = uVar57;
    auVar92._6_2_ = sStack_196;
    auVar92._8_2_ = local_198;
    auVar92._10_2_ = sStack_196;
    auVar92._12_2_ = local_198;
    auVar92._14_2_ = sStack_196;
    in_XMM8 = pmovsxbw(in_XMM8,0xfffefdfcfbfaf9);
    auVar98 = auVar92;
    for (; uVar40 != uVar42; uVar42 = uVar42 + 1) {
      auVar61._10_2_ = (short)piVar2[(long)(int)(uVar27 * iVar1) + (long)ptr[uVar42 + 5]];
      auVar61._8_2_ = (short)piVar2[(long)(int)(uVar41 * iVar1) + (long)ptr[uVar42 + 4]];
      auVar61._12_2_ = (short)piVar2[(long)(int)(uVar26 * iVar1) + (long)ptr[uVar42 + 6]];
      auVar61._14_2_ = (short)piVar2[(long)(int)(uVar50 * iVar1) + (long)ptr[uVar42 + 7]];
      auVar61._0_8_ =
           (ulong)(uint)piVar2[(long)(int)(uVar49 * iVar1) + (long)ptr[uVar42]] & 0xffffffff0000ffff
           | (ulong)*(ushort *)(piVar2 + (long)(int)(uVar47 * iVar1) + (long)ptr[uVar42 + 1]) <<
             0x10 | (ulong)*(ushort *)(piVar2 + (long)(int)(uVar52 * iVar1) + (long)ptr[uVar42 + 2])
                    << 0x20 |
           (ulong)*(ushort *)(piVar2 + (long)(int)(uVar28 * iVar1) + (long)ptr[uVar42 + 3]) << 0x30;
      auVar90._0_8_ = auVar89._2_8_;
      auVar90._8_8_ = auVar89._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar42 + 7] << 0x30;
      auVar95._0_8_ = auVar98._2_8_;
      auVar95._8_8_ = auVar98._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar42 + 7] << 0x30;
      auVar21._4_4_ = local_88;
      auVar21._0_4_ = local_88;
      auVar21._8_4_ = local_88;
      auVar21._12_4_ = local_88;
      auVar71 = psubsw(auVar90,auVar21);
      auVar98._4_4_ = local_98;
      auVar98._0_4_ = local_98;
      auVar98._8_4_ = local_98;
      auVar98._12_4_ = local_98;
      auVar96 = psubsw(auVar95,auVar98);
      sVar5 = auVar71._0_2_;
      sVar91 = auVar96._0_2_;
      auVar97._0_2_ = (ushort)(sVar91 < sVar5) * sVar5 | (ushort)(sVar91 >= sVar5) * sVar91;
      sVar5 = auVar71._2_2_;
      sVar91 = auVar96._2_2_;
      auVar97._2_2_ = (ushort)(sVar91 < sVar5) * sVar5 | (ushort)(sVar91 >= sVar5) * sVar91;
      sVar5 = auVar71._4_2_;
      sVar91 = auVar96._4_2_;
      auVar97._4_2_ = (ushort)(sVar91 < sVar5) * sVar5 | (ushort)(sVar91 >= sVar5) * sVar91;
      sVar5 = auVar71._6_2_;
      sVar91 = auVar96._6_2_;
      auVar97._6_2_ = (ushort)(sVar91 < sVar5) * sVar5 | (ushort)(sVar91 >= sVar5) * sVar91;
      sVar5 = auVar71._8_2_;
      sVar91 = auVar96._8_2_;
      auVar97._8_2_ = (ushort)(sVar91 < sVar5) * sVar5 | (ushort)(sVar91 >= sVar5) * sVar91;
      sVar5 = auVar71._10_2_;
      sVar91 = auVar96._10_2_;
      auVar97._10_2_ = (ushort)(sVar91 < sVar5) * sVar5 | (ushort)(sVar91 >= sVar5) * sVar91;
      sVar5 = auVar71._12_2_;
      sVar91 = auVar96._12_2_;
      sVar94 = auVar96._14_2_;
      auVar97._12_2_ = (ushort)(sVar91 < sVar5) * sVar5 | (ushort)(sVar91 >= sVar5) * sVar91;
      sVar5 = auVar71._14_2_;
      auVar97._14_2_ = (ushort)(sVar94 < sVar5) * sVar5 | (ushort)(sVar94 >= sVar5) * sVar94;
      auVar89 = psubsw(auVar89,auVar21);
      auVar92 = psubsw(auVar92,auVar98);
      sVar5 = auVar89._0_2_;
      sVar91 = auVar92._0_2_;
      auVar93._0_2_ = (ushort)(sVar91 < sVar5) * sVar5 | (ushort)(sVar91 >= sVar5) * sVar91;
      sVar5 = auVar89._2_2_;
      sVar91 = auVar92._2_2_;
      auVar93._2_2_ = (ushort)(sVar91 < sVar5) * sVar5 | (ushort)(sVar91 >= sVar5) * sVar91;
      sVar5 = auVar89._4_2_;
      sVar91 = auVar92._4_2_;
      auVar93._4_2_ = (ushort)(sVar91 < sVar5) * sVar5 | (ushort)(sVar91 >= sVar5) * sVar91;
      sVar5 = auVar89._6_2_;
      sVar91 = auVar92._6_2_;
      auVar93._6_2_ = (ushort)(sVar91 < sVar5) * sVar5 | (ushort)(sVar91 >= sVar5) * sVar91;
      sVar5 = auVar89._8_2_;
      sVar91 = auVar92._8_2_;
      auVar93._8_2_ = (ushort)(sVar91 < sVar5) * sVar5 | (ushort)(sVar91 >= sVar5) * sVar91;
      sVar5 = auVar89._10_2_;
      sVar91 = auVar92._10_2_;
      auVar93._10_2_ = (ushort)(sVar91 < sVar5) * sVar5 | (ushort)(sVar91 >= sVar5) * sVar91;
      sVar5 = auVar89._12_2_;
      sVar91 = auVar92._12_2_;
      sVar94 = auVar92._14_2_;
      auVar93._12_2_ = (ushort)(sVar91 < sVar5) * sVar5 | (ushort)(sVar91 >= sVar5) * sVar91;
      sVar5 = auVar89._14_2_;
      auVar93._14_2_ = (ushort)(sVar94 < sVar5) * sVar5 | (ushort)(sVar94 >= sVar5) * sVar94;
      auVar74 = paddsw(auVar74,auVar61);
      uVar76 = ((short)auVar93._0_2_ < (short)auVar97._0_2_) * auVar97._0_2_ |
               ((short)auVar93._0_2_ >= (short)auVar97._0_2_) * auVar93._0_2_;
      uVar80 = ((short)auVar93._2_2_ < (short)auVar97._2_2_) * auVar97._2_2_ |
               ((short)auVar93._2_2_ >= (short)auVar97._2_2_) * auVar93._2_2_;
      uVar81 = ((short)auVar93._4_2_ < (short)auVar97._4_2_) * auVar97._4_2_ |
               ((short)auVar93._4_2_ >= (short)auVar97._4_2_) * auVar93._4_2_;
      uVar82 = ((short)auVar93._6_2_ < (short)auVar97._6_2_) * auVar97._6_2_ |
               ((short)auVar93._6_2_ >= (short)auVar97._6_2_) * auVar93._6_2_;
      uVar83 = ((short)auVar93._8_2_ < (short)auVar97._8_2_) * auVar97._8_2_ |
               ((short)auVar93._8_2_ >= (short)auVar97._8_2_) * auVar93._8_2_;
      uVar84 = ((short)auVar93._10_2_ < (short)auVar97._10_2_) * auVar97._10_2_ |
               ((short)auVar93._10_2_ >= (short)auVar97._10_2_) * auVar93._10_2_;
      uVar85 = ((short)auVar93._12_2_ < (short)auVar97._12_2_) * auVar97._12_2_ |
               ((short)auVar93._12_2_ >= (short)auVar97._12_2_) * auVar93._12_2_;
      uVar86 = ((short)auVar93._14_2_ < (short)auVar97._14_2_) * auVar97._14_2_ |
               ((short)auVar93._14_2_ >= (short)auVar97._14_2_) * auVar93._14_2_;
      sVar5 = auVar74._0_2_;
      auVar78._0_2_ = (ushort)((short)uVar76 < sVar5) * sVar5 | ((short)uVar76 >= sVar5) * uVar76;
      sVar5 = auVar74._2_2_;
      auVar78._2_2_ = (ushort)((short)uVar80 < sVar5) * sVar5 | ((short)uVar80 >= sVar5) * uVar80;
      sVar5 = auVar74._4_2_;
      auVar78._4_2_ = (ushort)((short)uVar81 < sVar5) * sVar5 | ((short)uVar81 >= sVar5) * uVar81;
      sVar5 = auVar74._6_2_;
      auVar78._6_2_ = (ushort)((short)uVar82 < sVar5) * sVar5 | ((short)uVar82 >= sVar5) * uVar82;
      sVar5 = auVar74._8_2_;
      auVar78._8_2_ = (ushort)((short)uVar83 < sVar5) * sVar5 | ((short)uVar83 >= sVar5) * uVar83;
      sVar5 = auVar74._10_2_;
      auVar78._10_2_ = (ushort)((short)uVar84 < sVar5) * sVar5 | ((short)uVar84 >= sVar5) * uVar84;
      sVar5 = auVar74._12_2_;
      auVar78._12_2_ = (ushort)((short)uVar85 < sVar5) * sVar5 | ((short)uVar85 >= sVar5) * uVar85;
      sVar5 = auVar74._14_2_;
      auVar78._14_2_ = (ushort)((short)uVar86 < sVar5) * sVar5 | ((short)uVar86 >= sVar5) * uVar86;
      sVar56 = in_XMM8._0_2_;
      auVar96._0_2_ = -(ushort)(sVar56 == -1);
      sVar63 = in_XMM8._2_2_;
      auVar96._2_2_ = -(ushort)(sVar63 == -1);
      sVar64 = in_XMM8._4_2_;
      auVar96._4_2_ = -(ushort)(sVar64 == -1);
      sVar65 = in_XMM8._6_2_;
      auVar96._6_2_ = -(ushort)(sVar65 == -1);
      sVar66 = in_XMM8._8_2_;
      auVar96._8_2_ = -(ushort)(sVar66 == -1);
      sVar67 = in_XMM8._10_2_;
      auVar96._10_2_ = -(ushort)(sVar67 == -1);
      sVar68 = in_XMM8._12_2_;
      sVar69 = in_XMM8._14_2_;
      auVar96._12_2_ = -(ushort)(sVar68 == -1);
      auVar96._14_2_ = -(ushort)(sVar69 == -1);
      auVar89 = pblendvb(auVar78,local_188,auVar96);
      auVar71._4_2_ = local_198;
      auVar71._0_4_ = uVar57;
      auVar71._6_2_ = sStack_196;
      auVar71._8_2_ = local_198;
      auVar71._10_2_ = sStack_196;
      auVar71._12_2_ = local_198;
      auVar71._14_2_ = sStack_196;
      auVar98 = pblendvb(auVar97,auVar71,auVar96);
      auVar92 = pblendvb(auVar93,auVar71,auVar96);
      sVar5 = auVar89._0_2_;
      sVar91 = auVar89._2_2_;
      sVar16 = auVar89._14_2_;
      sVar10 = auVar89._8_2_;
      sVar12 = auVar89._10_2_;
      sVar14 = auVar89._12_2_;
      sVar94 = auVar89._4_2_;
      sVar9 = auVar89._6_2_;
      if (7 < uVar42) {
        bVar6 = sVar5 < (short)local_178;
        uVar84 = (ushort)!bVar6 * (short)local_178;
        bVar7 = sVar91 < local_178._2_2_;
        uVar76 = (ushort)!bVar7 * local_178._2_2_;
        bVar8 = sVar94 < local_178._4_2_;
        uVar83 = (ushort)!bVar8 * local_178._4_2_;
        bVar11 = sVar10 < (short)uStack_170;
        uVar82 = (ushort)!bVar11 * (short)uStack_170;
        bVar13 = sVar12 < uStack_170._2_2_;
        uVar81 = (ushort)!bVar13 * uStack_170._2_2_;
        bVar15 = sVar14 < uStack_170._4_2_;
        uVar80 = (ushort)!bVar15 * uStack_170._4_2_;
        local_178 = CONCAT26((ushort)(sVar9 < local_178._6_2_) * sVar9 |
                             (ushort)(sVar9 >= local_178._6_2_) * local_178._6_2_,
                             CONCAT24((ushort)bVar8 * sVar94 | uVar83,
                                      CONCAT22((ushort)bVar7 * sVar91 | uVar76,
                                               (ushort)bVar6 * sVar5 | uVar84)));
        uStack_170 = CONCAT26((ushort)(sVar16 < uStack_170._6_2_) * sVar16 |
                              (ushort)(sVar16 >= uStack_170._6_2_) * uStack_170._6_2_,
                              CONCAT24((ushort)bVar15 * sVar14 | uVar80,
                                       CONCAT22((ushort)bVar13 * sVar12 | uVar81,
                                                (ushort)bVar11 * sVar10 | uVar82)));
        local_168._2_2_ =
             (ushort)((short)local_168._2_2_ < sVar91) * sVar91 |
             (ushort)((short)local_168._2_2_ >= sVar91) * local_168._2_2_;
        local_168._0_2_ =
             (ushort)((short)local_168._0_2_ < sVar5) * sVar5 |
             (ushort)((short)local_168._0_2_ >= sVar5) * local_168._0_2_;
        local_168._4_2_ =
             (ushort)((short)local_168._4_2_ < sVar94) * sVar94 |
             (ushort)((short)local_168._4_2_ >= sVar94) * local_168._4_2_;
        local_168._6_2_ =
             (ushort)((short)local_168._6_2_ < sVar9) * sVar9 |
             (ushort)((short)local_168._6_2_ >= sVar9) * local_168._6_2_;
        local_168._8_2_ =
             (ushort)((short)local_168._8_2_ < sVar10) * sVar10 |
             (ushort)((short)local_168._8_2_ >= sVar10) * local_168._8_2_;
        local_168._10_2_ =
             (ushort)((short)local_168._10_2_ < sVar12) * sVar12 |
             (ushort)((short)local_168._10_2_ >= sVar12) * local_168._10_2_;
        local_168._12_2_ =
             (ushort)((short)local_168._12_2_ < sVar14) * sVar14 |
             (ushort)((short)local_168._12_2_ >= sVar14) * local_168._12_2_;
        local_168._14_2_ =
             (ushort)((short)local_168._14_2_ < sVar16) * sVar16 |
             (ushort)((short)local_168._14_2_ >= sVar16) * local_168._14_2_;
      }
      piVar3 = ((ppVar29->field_4).rowcols)->score_row;
      piVar4 = ((ppVar29->field_4).rowcols)->score_col;
      if (uVar35 == uVar37 && uVar42 < uVar53) {
        piVar3[uVar42] = (int)sVar16;
      }
      if (uVar31 == uVar42) {
        piVar4[uVar35] = (int)sVar16;
      }
      if (uVar42 - 1 < uVar53 && local_238 == uVar37) {
        piVar3[uVar42 - 1] = (int)sVar14;
      }
      if (uVar53 == uVar42 && (long)local_238 < lVar54) {
        piVar4[local_238] = (int)sVar14;
      }
      if ((local_200 == uVar37) && ((long)(uVar42 - 2) < (long)uVar53 && 1 < uVar42)) {
        piVar3[uVar42 - 2] = (int)sVar12;
      }
      if (uVar53 + 1 == uVar42 && (long)local_200 < lVar54) {
        piVar4[local_200] = (int)sVar12;
      }
      if ((uVar39 == uVar37) && ((long)(uVar42 - 3) < (long)uVar53 && 2 < uVar42)) {
        piVar3[uVar42 - 3] = (int)sVar10;
      }
      if (uVar53 + 2 == uVar42 && (long)uVar39 < lVar54) {
        piVar4[uVar39] = (int)sVar10;
      }
      if ((uVar38 == uVar37) && ((long)(uVar42 - 4) < (long)uVar53 && 3 < uVar42)) {
        piVar3[uVar42 - 4] = (int)sVar9;
      }
      if (uVar53 + 3 == uVar42 && (long)uVar38 < lVar54) {
        piVar4[uVar38] = (int)sVar9;
      }
      if ((uVar44 == uVar37) && ((long)(uVar42 - 5) < (long)uVar53 && 4 < uVar42)) {
        piVar3[uVar42 - 5] = (int)sVar94;
      }
      if (uVar53 + 4 == uVar42 && (long)uVar44 < lVar54) {
        piVar4[uVar44] = (int)sVar94;
      }
      if ((uVar30 == uVar37) && ((long)(uVar42 - 6) < (long)uVar53 && 5 < uVar42)) {
        piVar3[uVar42 - 6] = (int)sVar91;
      }
      if (uVar53 + 5 == uVar42 && (long)uVar30 < lVar54) {
        piVar4[uVar30] = (int)sVar91;
      }
      if (6 < uVar42 && uVar48 == uVar37) {
        piVar3[uVar42 - 7] = (int)sVar5;
      }
      if (uVar53 + 6 == uVar42 && (long)uVar48 < lVar54) {
        piVar4[uVar48] = (int)sVar5;
      }
      local_58._0_2_ = auVar60._0_2_;
      local_58._2_2_ = auVar60._2_2_;
      auVar72._0_2_ = -(ushort)((short)local_1a8._0_2_ < (short)local_58._0_2_);
      auVar72._2_2_ = -(ushort)((short)local_1a8._2_2_ < (short)local_58._2_2_);
      auVar72._4_2_ = -(ushort)((short)local_1a8._4_2_ < (short)local_58._0_2_);
      auVar72._6_2_ = -(ushort)((short)local_1a8._6_2_ < (short)local_58._2_2_);
      auVar72._8_2_ = -(ushort)((short)local_1a8._8_2_ < (short)local_58._0_2_);
      auVar72._10_2_ = -(ushort)((short)local_1a8._10_2_ < (short)local_58._2_2_);
      auVar72._12_2_ = -(ushort)((short)local_1a8._12_2_ < (short)local_58._0_2_);
      auVar72._14_2_ = -(ushort)((short)local_1a8._14_2_ < (short)local_58._2_2_);
      local_78._0_2_ = auVar70._0_2_;
      local_78._2_2_ = auVar70._2_2_;
      auVar62._0_2_ = -(ushort)(sVar56 < (short)local_78._0_2_);
      auVar62._2_2_ = -(ushort)(sVar63 < (short)local_78._2_2_);
      auVar62._4_2_ = -(ushort)(sVar64 < (short)local_78._0_2_);
      auVar62._6_2_ = -(ushort)(sVar65 < (short)local_78._2_2_);
      auVar62._8_2_ = -(ushort)(sVar66 < (short)local_78._0_2_);
      auVar62._10_2_ = -(ushort)(sVar67 < (short)local_78._2_2_);
      auVar62._12_2_ = -(ushort)(sVar68 < (short)local_78._0_2_);
      auVar62._14_2_ = -(ushort)(sVar69 < (short)local_78._2_2_);
      auVar74 = psraw(in_XMM8,0xf);
      auVar75._0_2_ = -(ushort)(auVar77._0_2_ < sVar5);
      auVar75._2_2_ = -(ushort)(auVar77._2_2_ < sVar91);
      auVar75._4_2_ = -(ushort)(auVar77._4_2_ < sVar94);
      auVar75._6_2_ = -(ushort)(auVar77._6_2_ < sVar9);
      auVar75._8_2_ = -(ushort)(auVar77._8_2_ < sVar10);
      auVar75._10_2_ = -(ushort)(auVar77._10_2_ < sVar12);
      auVar75._12_2_ = -(ushort)(auVar77._12_2_ < sVar14);
      auVar75._14_2_ = -(ushort)(auVar77._14_2_ < sVar16);
      auVar75 = ~auVar74 & auVar62 & auVar88 & auVar75;
      local_138 = pblendvb(auVar77,auVar78,auVar75);
      auVar79._0_2_ = -(ushort)(local_68._0_2_ == sVar56);
      auVar79._2_2_ = -(ushort)(local_68._2_2_ == sVar63);
      auVar79._4_2_ = -(ushort)(local_68._4_2_ == sVar64);
      auVar79._6_2_ = -(ushort)(local_68._6_2_ == sVar65);
      auVar79._8_2_ = -(ushort)(local_68._8_2_ == sVar66);
      auVar79._10_2_ = -(ushort)(local_68._10_2_ == sVar67);
      auVar79._12_2_ = -(ushort)(local_68._12_2_ == sVar68);
      auVar79._14_2_ = -(ushort)(local_68._14_2_ == sVar69);
      auVar77._0_2_ = -(ushort)(auVar73._0_2_ < sVar5);
      auVar77._2_2_ = -(ushort)(auVar73._2_2_ < sVar91);
      auVar77._4_2_ = -(ushort)(auVar73._4_2_ < sVar94);
      auVar77._6_2_ = -(ushort)(auVar73._6_2_ < sVar9);
      auVar77._8_2_ = -(ushort)(auVar73._8_2_ < sVar10);
      auVar77._10_2_ = -(ushort)(auVar73._10_2_ < sVar12);
      auVar77._12_2_ = -(ushort)(auVar73._12_2_ < sVar14);
      auVar77._14_2_ = -(ushort)(auVar73._14_2_ < sVar16);
      auVar77 = auVar72 & auVar79 & auVar77;
      local_148 = pblendvb(auVar73,auVar89,auVar77);
      local_c8 = pblendvb(local_c8,auVar89,auVar79 & auVar88);
      ptr_00[uVar42] = sVar5;
      ptr_01[uVar42] = auVar98._0_2_;
      local_158 = pblendvb(local_158,local_1a8,auVar77);
      local_48 = pblendvb(local_48,in_XMM8,auVar75);
      in_XMM8 = paddsw(in_XMM8,_DAT_008a1ba0);
      auVar74 = auVar90;
      auVar73 = local_148;
      auVar77 = local_138;
    }
    local_1a8 = paddsw(local_1a8,_DAT_008a1bb0);
    auVar20._4_4_ = uStack_d4;
    auVar20._0_4_ = local_d8;
    auVar20._8_4_ = uStack_d0;
    auVar20._12_4_ = uStack_cc;
    local_188 = psubsw(local_188,auVar20);
    uVar35 = local_120;
  }
  lVar54 = 0;
  uVar28 = 0;
  uVar32 = 0;
  uVar40 = 0;
  uVar26 = uVar45;
  uVar27 = uVar45;
  while( true ) {
    uVar25 = (ushort)uVar26;
    uVar76 = (ushort)uVar45;
    if ((int)lVar54 == 8) break;
    uVar80 = *(ushort *)(local_148 + lVar54 * 2);
    if ((short)uVar25 < (short)uVar80) {
      uVar47 = (int)*(short *)(local_158 + lVar54 * 2);
      uVar32 = (int)*(short *)(local_158 + lVar54 * 2);
      uVar26 = (uint)uVar80;
    }
    else {
      uVar47 = uVar40;
      if (uVar80 == uVar25) {
        uVar49 = (uint)*(short *)(local_158 + lVar54 * 2);
        uVar47 = uVar32;
        if ((int)uVar49 <= (int)uVar40) {
          uVar47 = uVar49;
        }
        uVar32 = uVar47;
        if ((int)uVar49 < (int)uVar40) {
          uVar26 = (uint)uVar80;
        }
      }
    }
    if ((short)uVar76 < (short)*(ushort *)(local_138 + lVar54 * 2)) {
      uVar28 = (uint)*(short *)(local_48 + lVar54 * 2);
      uVar45 = (uint)*(ushort *)(local_138 + lVar54 * 2);
    }
    uVar40 = (uint)*(ushort *)(local_c8 + lVar54 * 2);
    if ((short)*(ushort *)(local_c8 + lVar54 * 2) <= (short)(ushort)uVar27) {
      uVar40 = uVar27;
    }
    uVar27 = uVar40;
    lVar54 = lVar54 + 1;
    uVar40 = uVar47;
  }
  uVar80 = uVar76;
  uVar45 = uVar28;
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end != 0) goto LAB_006acb72;
    uVar80 = (ushort)uVar27;
    uVar45 = uVar31;
    if (s2_end != 0) {
      uVar80 = uVar76;
      uVar45 = uVar28;
    }
  }
  else if (((short)uVar76 < (short)uVar25) || ((uVar25 == uVar76 && (uVar28 == uVar31))))
  goto LAB_006acb72;
  uVar31 = uVar45;
  uVar25 = uVar80;
  uVar40 = uVar55;
LAB_006acb72:
  auVar60._0_2_ = -(ushort)((short)local_178 < local_198);
  auVar60._2_2_ = -(ushort)(local_178._2_2_ < sStack_196);
  auVar60._4_2_ = -(ushort)(local_178._4_2_ < local_198);
  auVar60._6_2_ = -(ushort)(local_178._6_2_ < sStack_196);
  auVar60._8_2_ = -(ushort)((short)uStack_170 < local_198);
  auVar60._10_2_ = -(ushort)(uStack_170._2_2_ < sStack_196);
  auVar60._12_2_ = -(ushort)(uStack_170._4_2_ < local_198);
  auVar60._14_2_ = -(ushort)(uStack_170._6_2_ < sStack_196);
  auVar70._0_2_ = -(ushort)(local_e8 < (short)local_168._0_2_);
  auVar70._2_2_ = -(ushort)(sStack_e6 < (short)local_168._2_2_);
  auVar70._4_2_ = -(ushort)(local_e8 < (short)local_168._4_2_);
  auVar70._6_2_ = -(ushort)(sStack_e6 < (short)local_168._6_2_);
  auVar70._8_2_ = -(ushort)(local_e8 < (short)local_168._8_2_);
  auVar70._10_2_ = -(ushort)(sStack_e6 < (short)local_168._10_2_);
  auVar70._12_2_ = -(ushort)(local_e8 < (short)local_168._12_2_);
  auVar70._14_2_ = -(ushort)(sStack_e6 < (short)local_168._14_2_);
  auVar70 = auVar70 | auVar60;
  if ((((((((((((((((auVar70 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar70 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar70 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar70 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar70 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar70 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar70 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar70 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar70 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar70 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar70 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar70 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar70[0xf] < '\0') {
    *(byte *)&ppVar29->flag = (byte)ppVar29->flag | 0x40;
    uVar25 = 0;
    uVar31 = 0;
    uVar40 = 0;
  }
  ppVar29->score = (int)(short)uVar25;
  ppVar29->end_query = uVar40;
  ppVar29->end_ref = uVar31;
  sStack_e4 = local_e8;
  sStack_e2 = sStack_e6;
  sStack_e0 = local_e8;
  sStack_de = sStack_e6;
  sStack_dc = local_e8;
  sStack_da = sStack_e6;
  local_b8 = auVar22;
  local_a8 = auVar59;
  local_78 = auVar23;
  local_68 = auVar87;
  local_58 = auVar24;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(local_1f8);
    return ppVar29;
  }
  return ppVar29;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = s1_beg ? _mm_set1_epi16(0) : _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi16(0) : _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi16(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi16(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi16(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi16(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi16(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}